

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defopcode.c
# Opt level: O1

void delete_field(List *code,int field_number,int val)

{
  byte bVar1;
  TokenType TVar2;
  anon_union_8_7_0ba269be_for_u aVar3;
  
  aVar3.n._4_4_ = 0;
  aVar3.n._0_4_ = val;
  for (; code != (List *)0x0; code = code->cdr) {
    TVar2 = (code->token).type;
    if (TVar2 - TOK_DOLLAR_DATA_REGISTER < 8) {
      bVar1 = (code->token).u.reginfo.which;
      if ((uint)bVar1 == field_number) {
        if (TVar2 == TOK_DOLLAR_NUMBER) {
          (code->token).type = TOK_NUMBER;
          (code->token).u = aVar3;
        }
        else {
          parse_error(code,"Deleting field that still exists!\n");
        }
      }
      else if (field_number < (int)(uint)bVar1) {
        (code->token).u.reginfo.which = bVar1 - 1;
      }
    }
    delete_field(code->car,field_number,val);
  }
  return;
}

Assistant:

static void
delete_field (List *code, int field_number, int val)
{
  if (code == NULL)
    return;
  if (IS_DOLLAR_TOKEN (code->token.type))
    {
      if (code->token.u.dollarinfo.which == field_number)
	{
	  if (code->token.type != TOK_DOLLAR_NUMBER)
	    parse_error (code, "Deleting field that still exists!\n");
	  else
	    {
	      code->token.type = TOK_NUMBER;
	      code->token.u.n = val;
	    }
	}
      else if (code->token.u.dollarinfo.which > field_number)
	--code->token.u.dollarinfo.which;
    }

  delete_field (code->car, field_number, val);
  delete_field (code->cdr, field_number, val);
}